

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O1

void Llb_ManLabelLiCones(Aig_Man_t *p)

{
  undefined1 *puVar1;
  ulong *puVar2;
  uint uVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      puVar2 = (ulong *)((long)pVVar5->pArray[lVar4] + 0x18);
      *puVar2 = *puVar2 | 0x20;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  if (0 < p->nRegs) {
    iVar6 = 0;
    do {
      uVar3 = p->nTruePos + iVar6;
      if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Llb_ManLabelLiCones_rec
                (p,(Aig_Obj_t *)(*(ulong *)((long)p->vCos->pArray[uVar3] + 8) & 0xfffffffffffffffe))
      ;
      iVar6 = iVar6 + 1;
    } while (iVar6 < p->nRegs);
  }
  return;
}

Assistant:

void Llb_ManLabelLiCones( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // mark const and PIs
    Aig_ManConst1(p)->fMarkB = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkB = 1;
    // mark cones
    Saig_ManForEachLi( p, pObj, i )
        Llb_ManLabelLiCones_rec( p, Aig_ObjFanin0(pObj) );
}